

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  FILE *__stream;
  uint *puVar2;
  void *buffer;
  _Bool result;
  void *encoded_data;
  size_t encoded_size;
  void *pixel_data;
  size_t stride;
  bmp_dib_header_t dib_header;
  bmp_header_t header;
  FILE *input_stream;
  options_t options;
  char **argv_local;
  int argc_local;
  
  options._16_8_ = argv;
  _Var1 = parse_command_line_options(argc,argv,(options_t *)&input_stream);
  if (_Var1) {
    __stream = fopen((char *)input_stream,"rb");
    if (__stream == (FILE *)0x0) {
      puVar2 = (uint *)__errno_location();
      printf("Failed to open file: %s, errno: %d\n",input_stream,(ulong)*puVar2);
      argv_local._4_4_ = 1;
    }
    else {
      _Var1 = bmp_read_header((FILE *)__stream,(bmp_header_t *)&dib_header.number_colors);
      if ((_Var1) &&
         (_Var1 = bmp_read_dib_header((FILE *)__stream,(bmp_dib_header_t *)&stride), _Var1)) {
        if ((dib_header.height == 0) && (dib_header.width._2_2_ == 0x18)) {
          if ((stride._4_4_ == 0) || (dib_header.header_size == 0)) {
            printf("Can only process an image that is 1 x 1 or bigger");
            fclose(__stream);
            argv_local._4_4_ = 1;
          }
          else {
            encoded_size = (size_t)bmp_read_pixel_data((FILE *)__stream,header.file_size,
                                                       (bmp_dib_header_t *)&stride,
                                                       (size_t *)&pixel_data);
            fclose(__stream);
            if (encoded_size == 0) {
              printf("Failed to read the BMP pixel data from the file: %s\n",
                     *(undefined8 *)(options._16_8_ + 8));
              argv_local._4_4_ = 1;
            }
            else {
              if ((int)dib_header.header_size < 1) {
                if ((int)dib_header.header_size < 1) {
                  dib_header.header_size = -dib_header.header_size;
                }
              }
              else {
                _Var1 = convert_bottom_up_to_top_down
                                  ((uint8_t *)encoded_size,(ulong)stride._4_4_,
                                   (long)(int)dib_header.header_size,(size_t)pixel_data);
                if (!_Var1) {
                  printf("Failed to convert the pixels from bottom up to top down\n");
                  return 1;
                }
              }
              convert_bgr_to_rgb((uint8_t *)encoded_size,(ulong)stride._4_4_,
                                 (long)(int)dib_header.header_size,(size_t)pixel_data);
              buffer = encode_bmp_to_jpegls
                                 ((void *)encoded_size,(size_t)pixel_data,
                                  (bmp_dib_header_t *)&stride,
                                  (charls_interleave_mode)options.output_filename,
                                  options.output_filename._4_4_,(size_t *)&encoded_data);
              free((void *)encoded_size);
              if (buffer == (void *)0x0) {
                argv_local._4_4_ = 1;
              }
              else {
                _Var1 = save_jpegls_file(options.input_filename,buffer,(size_t)encoded_data);
                free(buffer);
                if (_Var1) {
                  argv_local._4_4_ = 0;
                }
                else {
                  printf("Failed to write encoded data to the file: %s\n",options.input_filename);
                  argv_local._4_4_ = 1;
                }
              }
            }
          }
        }
        else {
          printf("Can only convert uncompressed 24 bits BMP files");
          fclose(__stream);
          argv_local._4_4_ = 1;
        }
      }
      else {
        printf("Failed to read the BMP info from the file: %s\n",*(undefined8 *)(options._16_8_ + 8)
              );
        fclose(__stream);
        argv_local._4_4_ = 1;
      }
    }
  }
  else {
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(const int argc, char* argv[])
{
    options_t options;
    if (!parse_command_line_options(argc, argv, &options))
        return EXIT_FAILURE;

    FILE* input_stream = fopen(options.input_filename, "rb");
    if (!input_stream)
    {
        printf("Failed to open file: %s, errno: %d\n", options.input_filename, errno);
        return EXIT_FAILURE;
    }

    bmp_header_t header;
    bmp_dib_header_t dib_header;
    if (!bmp_read_header(input_stream, &header) || !bmp_read_dib_header(input_stream, &dib_header))
    {
        printf("Failed to read the BMP info from the file: %s\n", argv[1]);
        (void) fclose(input_stream);
        return EXIT_FAILURE;
    }

    if (dib_header.compress_type != 0 || dib_header.depth != 24)
    {
        printf("Can only convert uncompressed 24 bits BMP files");
        (void) fclose(input_stream);
        return EXIT_FAILURE;
    }

    if (dib_header.width == 0 || dib_header.height == 0)
    {
        printf("Can only process an image that is 1 x 1 or bigger");
        (void) fclose(input_stream);
        return EXIT_FAILURE;
    }

    size_t stride;
    void* pixel_data = bmp_read_pixel_data(input_stream, header.offset, &dib_header, &stride);
    (void ) fclose(input_stream);

    if (!pixel_data)
    {
        printf("Failed to read the BMP pixel data from the file: %s\n", argv[1]);
        return EXIT_FAILURE;
    }

    // Pixels in the BMP file format are stored bottom up (when the height parameter is positive), JPEG-LS requires top down.
    if (dib_header.height > 0)
    {
        if (!convert_bottom_up_to_top_down(pixel_data, dib_header.width, (size_t)dib_header.height, stride))
        {
            printf("Failed to convert the pixels from bottom up to top down\n");
            return EXIT_FAILURE;
        }
    }
    else
    {
        dib_header.height = abs(dib_header.height);
    }

    // Pixels in the BMP file format are stored as BGR. JPEG-LS (SPIFF header) only supports the RGB color model.
    // Note: without the optional SPIFF header no color information is stored in the JPEG-LS file and the common assumption
    // is RGB.
    convert_bgr_to_rgb(pixel_data, dib_header.width, (size_t)dib_header.height, stride);

    size_t encoded_size;
    void* encoded_data =
        encode_bmp_to_jpegls(pixel_data, stride, &dib_header, options.interleave_mode, options.near_lossless, &encoded_size);
    free(pixel_data);
    if (!encoded_data)
        return EXIT_FAILURE; // error already printed.

    const bool result = save_jpegls_file(options.output_filename, encoded_data, encoded_size);
    free(encoded_data);
    if (!result)
    {
        printf("Failed to write encoded data to the file: %s\n", options.output_filename);
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}